

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DynamicTypeHandler::SetPropertyUpdateSideEffect
          (DynamicTypeHandler *this,DynamicObject *instance,CharacterBuffer<char16_t> *propertyName,
          Var value,SideEffects possibleSideEffects)

{
  ScriptContext *this_00;
  JavascriptLibrary *pJVar1;
  bool bVar2;
  SideEffects se;
  undefined3 in_register_00000081;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  if (CONCAT31(in_register_00000081,possibleSideEffects) == 0) {
    return;
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  bVar2 = BuiltInPropertyRecord<8>::Equals
                    ((BuiltInPropertyRecord<8> *)BuiltInPropertyRecords::valueOf,
                     (propertyName->string).ptr,propertyName->len);
  if (bVar2) {
    se = possibleSideEffects & SideEffects_ValueOf;
  }
  else {
    bVar2 = BuiltInPropertyRecord<9>::Equals
                      ((BuiltInPropertyRecord<9> *)BuiltInPropertyRecords::toString,
                       (propertyName->string).ptr,propertyName->len);
    if (!bVar2) {
      bVar2 = BuiltInPropertyRecord<5>::Equals
                        ((BuiltInPropertyRecord<5> *)BuiltInPropertyRecords::Math,
                         (propertyName->string).ptr,propertyName->len);
      pJVar1 = (this_00->super_ScriptContextBase).javascriptLibrary;
      if (bVar2) {
        if ((pJVar1->super_JavascriptLibraryBase).globalObject.ptr == (GlobalObject *)instance) {
          se = possibleSideEffects & SideEffects_MathFunc;
          goto LAB_00ccc313;
        }
      }
      else if ((((pJVar1->super_JavascriptLibraryBase).mathObject.ptr == instance) &&
               (ScriptContext::FindPropertyRecord
                          (this_00,(propertyName->string).ptr,propertyName->len,&local_30),
               local_30 != (PropertyRecord *)0x0)) &&
              (bVar2 = IsMathLibraryId(local_30->pid), bVar2)) {
        ScriptContextOptimizationOverrideInfo::SetSideEffects
                  (&this_00->optimizationOverrides,possibleSideEffects & SideEffects_MathFunc);
      }
      return;
    }
    se = possibleSideEffects & SideEffects_ToString;
  }
LAB_00ccc313:
  ScriptContextOptimizationOverrideInfo::SetSideEffects(&this_00->optimizationOverrides,se);
  return;
}

Assistant:

void DynamicTypeHandler::SetPropertyUpdateSideEffect(DynamicObject* instance, JsUtil::CharacterBuffer<WCHAR> const& propertyName, Var value, SideEffects possibleSideEffects)
    {
        if (possibleSideEffects)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            if (BuiltInPropertyRecords::valueOf.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_ValueOf & possibleSideEffects));
            }
            else if (BuiltInPropertyRecords::toString.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_ToString & possibleSideEffects));
            }
            else if (BuiltInPropertyRecords::Math.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                if (instance == scriptContext->GetLibrary()->GetGlobalObject())
                {
                    scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_MathFunc & possibleSideEffects));
                }
            }
            else if (instance == scriptContext->GetLibrary()->GetMathObject())
            {
                PropertyRecord const* propertyRecord;
                scriptContext->FindPropertyRecord(propertyName.GetBuffer(), propertyName.GetLength(), &propertyRecord);

                if (propertyRecord && IsMathLibraryId(propertyRecord->GetPropertyId()))
                {
                    scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_MathFunc & possibleSideEffects));
                }
            }

        }
    }